

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
PreventExtensions(SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
                  *this,DynamicObject *instance)

{
  byte bVar1;
  bool bVar2;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar3;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this_local;
  
  bVar1 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
  if ((bVar1 & 1) == 0) {
    this_local._4_4_ = 1;
  }
  else {
    bVar2 = DynamicTypeHandler::GetIsLocked(&this->super_DynamicTypeHandler);
    if (bVar2) {
      pDVar3 = ConvertToDictionaryType(this,instance);
      this_local._4_4_ =
           (*(pDVar3->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x36])(pDVar3,instance);
    }
    else {
      this_local._4_4_ = PreventExtensionsInternal(this,instance);
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::PreventExtensions(DynamicObject* instance)
    {
        if (IsNotExtensibleSupported)
        {
            if ((this->GetFlags() & IsExtensibleFlag) == 0)
            {
                // Already not extensible => no further change needed.
                return TRUE;
            }

            if (!GetIsLocked())
            {
                // If the type is not shared with others, we can just change it by itself.
                return PreventExtensionsInternal(instance);
            }
        }

        return ConvertToDictionaryType(instance)->PreventExtensions(instance);
    }